

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmem.c
# Opt level: O0

void * luaM_shrinkvector_(lua_State *L,void *block,int *size,int final_n,int size_elem)

{
  void *pvVar1;
  size_t newsize;
  size_t oldsize;
  void *newblock;
  int size_elem_local;
  int final_n_local;
  int *size_local;
  void *block_local;
  lua_State *L_local;
  
  pvVar1 = luaM_saferealloc_(L,block,(long)(*size * size_elem),(long)(final_n * size_elem));
  *size = final_n;
  return pvVar1;
}

Assistant:

void *luaM_shrinkvector_ (lua_State *L, void *block, int *size,
                          int final_n, int size_elem) {
  void *newblock;
  size_t oldsize = cast_sizet((*size) * size_elem);
  size_t newsize = cast_sizet(final_n * size_elem);
  lua_assert(newsize <= oldsize);
  newblock = luaM_saferealloc_(L, block, oldsize, newsize);
  *size = final_n;
  return newblock;
}